

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

int opengv::absolute_pose::modules::gpnp1::init(EVP_PKEY_CTX *ctx)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  CoeffReturnType pdVar4;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  RealScalar RVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *this_00;
  RealScalar RVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  double c03w;
  double c02w;
  double c01w;
  Vector3d temp;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffaa8;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffab0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffad0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffad8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (in_stack_fffffffffffffab0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffaa8);
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffaa8);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  dVar13 = (double)this * RVar5;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            (in_stack_fffffffffffffab0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)
            Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  dVar14 = (double)this_00 * RVar5;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)this);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(this);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917cac);
  dVar8 = *pSVar2 * -2.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917cd4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917cf4);
  dVar7 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917d1c);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = SVar1;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar8;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = -(dVar7 * 2.0 * *pSVar2);
  auVar15 = vfmadd213sd_fma(auVar15,auVar63,auVar111);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917d6a);
  dVar7 = *pSVar2 * 2.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917d92);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = auVar15._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pSVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = -dVar7;
  auVar15 = vfmadd213sd_fma(auVar16,auVar64,auVar112);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917dd8);
  dVar7 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917e13);
  dVar8 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917e4e);
  dVar9 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917e89);
  dVar10 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917ec4);
  dVar11 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917eff);
  dVar12 = pow(*pSVar2,2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x917f38);
  *pSVar3 = auVar15._0_8_ + dVar7 + dVar8 + dVar9 + dVar10 + dVar11 + dVar12;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x917f56);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917f7f);
  SVar1 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x917fa0);
  dVar8 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x917fc8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = SVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar7 * 2.0;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = -(dVar8 * 2.0 * *pSVar2);
  auVar15 = vfmadd213sd_fma(auVar17,auVar65,auVar113);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91801d);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918048);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = auVar15._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *pdVar4;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar18,auVar66,auVar114);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918099);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9180c4);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = auVar15._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar7 * 2.0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar19,auVar67,auVar115);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9180fe);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918129);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar15._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar7 * 2.0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar20,auVar68,auVar116);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918163);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91818e);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = auVar15._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar2;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar21,auVar69,auVar117);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9181df);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91820a);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = auVar15._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pdVar4;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar22,auVar70,auVar118);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91825b);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918286);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = auVar15._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar7 * 2.0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar23,auVar71,auVar119);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9182c0);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9182eb);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = auVar15._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar7 * 2.0;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar24,auVar72,auVar120);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918325);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918350);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = auVar15._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar2;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar25,auVar73,auVar121);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9183a1);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9183cc);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = auVar15._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pdVar4;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar26,auVar74,auVar122);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91841d);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918448);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = auVar15._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar7 * 2.0;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar27,auVar75,auVar123);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x918482);
  *pSVar3 = auVar15._0_8_;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9184cc);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91850b);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918536);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = -dVar13 + dVar8;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pdVar4;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar28,auVar76,auVar124);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918587);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9185c8);
  dVar13 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918609);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918634);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = auVar15._0_8_ + dVar8 + dVar13;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pdVar4;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar29,auVar77,auVar125);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918685);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9186c6);
  dVar13 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918707);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918732);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = auVar15._0_8_ + dVar8 + dVar13;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pdVar4;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar30,auVar78,auVar126);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918783);
  dVar7 = pow(*pdVar4,2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x9187c4);
  *pSVar3 = auVar15._0_8_ + dVar7;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9187e5);
  dVar7 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918810);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918833);
  dVar8 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91885e);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SVar1;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar7 * -2.0;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = -(dVar8 * 2.0 * *pSVar2);
  auVar15 = vfmadd213sd_fma(auVar31,auVar79,auVar127);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9188b8);
  dVar7 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9188e3);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = auVar15._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar2;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar32,auVar80,auVar128);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918932);
  dVar7 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918973);
  dVar8 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9189b4);
  dVar13 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9189f5);
  dVar9 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918a36);
  dVar10 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918a77);
  dVar11 = pow(*pSVar2,2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x918ab8);
  *pSVar3 = auVar15._0_8_ + dVar7 + dVar8 + dVar13 + dVar9 + dVar10 + dVar11;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918ad9);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918b02);
  SVar1 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918b25);
  dVar8 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918b50);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SVar1;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar7 * 2.0;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar8 * 2.0 * *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar33,auVar81,auVar129);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918b93);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918bbe);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = auVar15._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar7 * 2.0;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar34,auVar82,auVar130);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918bf6);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918c21);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = auVar15._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pSVar2;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar35,auVar83,auVar131);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918c70);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918c9b);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = auVar15._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pdVar4;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar36,auVar84,auVar132);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918cec);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918d17);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = auVar15._0_8_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar7 * 2.0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar37,auVar85,auVar133);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918d51);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918d7c);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = auVar15._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pSVar2;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar38,auVar86,auVar134);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918dcd);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918df8);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = auVar15._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pdVar4;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar39,auVar87,auVar135);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918e49);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918e74);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = auVar15._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar7 * 2.0;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar40,auVar88,auVar136);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918eae);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918ed9);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = auVar15._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *pSVar2;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar41,auVar89,auVar137);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918f2a);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918f55);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = auVar15._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *pdVar4;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar42,auVar90,auVar138);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x918fa6);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x918fd1);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = auVar15._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar7 * 2.0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar43,auVar91,auVar139);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x91900a);
  *pSVar3 = auVar15._0_8_;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919054);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919095);
  dVar13 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9190d6);
  dVar9 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919115);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919140);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = -dVar14 + dVar8 + dVar13 + dVar9;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pdVar4;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar44,auVar92,auVar140);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919191);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9191d2);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9191fd);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = auVar15._0_8_ + dVar8;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pdVar4;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar45,auVar93,auVar141);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91924e);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91928f);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9192ba);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = auVar15._0_8_ + dVar8;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pdVar4;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar46,auVar94,auVar142);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91930b);
  dVar7 = pow(*pdVar4,2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x91934d);
  *pSVar3 = auVar15._0_8_ + dVar7;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91936e);
  dVar7 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919399);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9193bc);
  dVar8 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9193e7);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = SVar1;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar7 * -2.0;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = -(dVar8 * 2.0 * *pSVar2);
  auVar15 = vfmadd213sd_fma(auVar47,auVar95,auVar143);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919441);
  dVar7 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91946c);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = auVar15._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *pSVar2;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar48,auVar96,auVar144);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9194bb);
  dVar7 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9194fc);
  dVar8 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91953d);
  dVar13 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91957e);
  dVar14 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9195bf);
  dVar9 = pow(*pSVar2,2.0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919600);
  dVar10 = pow(*pSVar2,2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x919641);
  *pSVar3 = auVar15._0_8_ + dVar7 + dVar8 + dVar13 + dVar14 + dVar9 + dVar10;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919662);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x91968b);
  SVar1 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9196ae);
  dVar8 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9196d9);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = SVar1;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar7 * 2.0;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar8 * 2.0 * *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar49,auVar97,auVar145);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91971c);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919747);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = auVar15._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar7 * 2.0;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar50,auVar98,auVar146);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x91977f);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9197aa);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = auVar15._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pSVar2;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar51,auVar99,auVar147);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9197f9);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919824);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = auVar15._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *pdVar4;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar52,auVar100,auVar148);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919875);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9198a0);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = auVar15._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar7 * 2.0;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar53,auVar101,auVar149);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9198da);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919905);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = auVar15._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pSVar2;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar54,auVar102,auVar150);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919956);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919981);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = auVar15._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *pdVar4;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar55,auVar103,auVar151);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x9199d2);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x9199fd);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = auVar15._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar7 * 2.0;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar56,auVar104,auVar152);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919a37);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919a62);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = auVar15._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *pSVar2;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar57,auVar105,auVar153);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919ab3);
  dVar7 = *pSVar2;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919ade);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = auVar15._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pdVar4;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar58,auVar106,auVar154);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919b2f);
  dVar7 = *pdVar4;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                     (this_00,(Index)this,0x919b5a);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = auVar15._0_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar7 * 2.0;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pSVar2;
  auVar15 = vfmadd213sd_fma(auVar59,auVar107,auVar155);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x919b95);
  *pSVar3 = auVar15._0_8_;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919bdf);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919c20);
  dVar13 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919c61);
  dVar14 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919ca0);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919ccb);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = -(RVar5 * RVar6) + dVar8 + dVar13 + dVar14;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *pdVar4;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar60,auVar108,auVar156);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919d1c);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919d5d);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919d88);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = auVar15._0_8_ + dVar8;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pdVar4;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar61,auVar109,auVar157);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919dd9);
  dVar8 = pow(*pdVar4,2.0);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919e1a);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919e45);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = auVar15._0_8_ + dVar8;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pdVar4;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = -(dVar7 * 2.0);
  auVar15 = vfmadd213sd_fma(auVar62,auVar110,auVar158);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0> *)this_00,
                      (Index)this,0x919e96);
  dVar7 = pow(*pdVar4,2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_5,_3,_0,_5,_3>,_1> *)this_00,
                      (Index)this,0x919ed6);
  *pSVar3 = auVar15._0_8_ + dVar7;
  return (int)pSVar3;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp1::init(
    Eigen::Matrix<double,5,3> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();

  groebnerMatrix(0,0) = -2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0)-2*n(2,0)*n(5,0)+pow(n(0,0),2)+pow(n(3,0),2)+pow(n(1,0),2)+pow(n(4,0),2)+pow(n(2,0),2)+pow(n(5,0),2);
  groebnerMatrix(0,1) = 2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0)-2*n(0,0)*a(3,0)+2*a(3,0)*n(3,0)+2*a(1,0)*n(1,0)-2*a(1,0)*n(4,0)-2*n(1,0)*a(4,0)+2*a(4,0)*n(4,0)+2*a(2,0)*n(2,0)-2*a(2,0)*n(5,0)-2*n(2,0)*a(5,0)+2*a(5,0)*n(5,0);
  groebnerMatrix(0,2) = -c01w+pow(a(0,0),2)-2*a(0,0)*a(3,0)+pow(a(3,0),2)+pow(a(1,0),2)-2*a(1,0)*a(4,0)+pow(a(4,0),2)+pow(a(2,0),2)-2*a(2,0)*a(5,0)+pow(a(5,0),2);
  groebnerMatrix(1,0) = -2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0)-2*n(2,0)*n(8,0)+pow(n(0,0),2)+pow(n(1,0),2)+pow(n(2,0),2)+pow(n(6,0),2)+pow(n(7,0),2)+pow(n(8,0),2);
  groebnerMatrix(1,1) = 2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0)+2*a(2,0)*n(2,0)-2*a(0,0)*n(6,0)-2*n(0,0)*a(6,0)+2*a(6,0)*n(6,0)-2*a(1,0)*n(7,0)-2*n(1,0)*a(7,0)+2*a(7,0)*n(7,0)-2*a(2,0)*n(8,0)-2*n(2,0)*a(8,0)+2*a(8,0)*n(8,0);
  groebnerMatrix(1,2) = -c02w+pow(a(0,0),2)+pow(a(1,0),2)+pow(a(2,0),2)-2*a(0,0)*a(6,0)+pow(a(6,0),2)-2*a(1,0)*a(7,0)+pow(a(7,0),2)-2*a(2,0)*a(8,0)+pow(a(8,0),2);
  groebnerMatrix(2,0) = -2*n(0,0)*n(9,0)-2*n(1,0)*n(10,0)-2*n(2,0)*n(11,0)+pow(n(0,0),2)+pow(n(1,0),2)+pow(n(2,0),2)+pow(n(9,0),2)+pow(n(10,0),2)+pow(n(11,0),2);
  groebnerMatrix(2,1) = 2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0)+2*a(2,0)*n(2,0)-2*a(0,0)*n(9,0)-2*n(0,0)*a(9,0)+2*a(9,0)*n(9,0)-2*a(1,0)*n(10,0)-2*n(1,0)*a(10,0)+2*a(10,0)*n(10,0)-2*a(2,0)*n(11,0)-2*n(2,0)*a(11,0)+2*a(11,0)*n(11,0);
  groebnerMatrix(2,2) = -c03w+pow(a(0,0),2)+pow(a(1,0),2)+pow(a(2,0),2)-2*a(0,0)*a(9,0)+pow(a(9,0),2)-2*a(1,0)*a(10,0)+pow(a(10,0),2)-2*a(2,0)*a(11,0)+pow(a(11,0),2);
}